

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

void av1_set_mb_wiener_variance(AV1_COMP *cpi)

{
  byte bVar1;
  BLOCK_SIZE bsize;
  SequenceHeader *pSVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  int rate_sum;
  int row_1;
  int col;
  int c;
  uint uVar8;
  ulong uVar9;
  int mi_col;
  int iVar10;
  int row;
  uint uVar11;
  int mi_row;
  int iVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double sum_est_rate;
  double sum_rec_distortion;
  MB_MODE_INFO *mbmi_ptr;
  MB_MODE_INFO mbmi;
  tran_low_t coeff [1024];
  int16_t src_diff [1024];
  tran_low_t qcoeff [1024];
  double local_3950;
  uint local_3944;
  double local_3930;
  double local_3928;
  ThreadData_conflict *local_3920;
  MB_MODE_INFO *local_3918;
  MB_MODE_INFO local_3910;
  float local_3860 [1024];
  int16_t local_2860 [1024];
  tran_low_t local_2060 [1024];
  tran_low_t local_1060 [1036];
  
  pSVar2 = (cpi->common).seq_params;
  iVar3 = aom_realloc_frame_buffer
                    (&((cpi->common).cur_frame)->buf,(cpi->common).width,(cpi->common).height,
                     pSVar2->subsampling_x,pSVar2->subsampling_y,(uint)pSVar2->use_highbitdepth,
                     (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                     (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                     cpi->alloc_pyramid,0);
  if (iVar3 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer");
  }
  local_3920 = &cpi->td;
  av1_alloc_mb_wiener_var_pred_buf(&cpi->common,local_3920);
  cpi->norm_wiener_variance = 0;
  iVar12 = 0;
  memset(&local_3910,0,0xb0);
  (cpi->td).mb.e_mbd.mi = &local_3918;
  (cpi->common).quant_params.base_qindex = (cpi->oxcf).rc_cfg.cq_level;
  local_3918 = &local_3910;
  av1_frame_init_quantizer(cpi);
  local_3928 = 0.0;
  local_3930 = 0.0;
  iVar3 = (cpi->mt_info).num_workers;
  iVar10 = (cpi->mt_info).num_mod_workers[0xb];
  if (iVar10 < iVar3) {
    iVar3 = iVar10;
  }
  (cpi->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  (cpi->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  if ((iVar3 < 2) || ((cpi->oxcf).intra_mode_cfg.auto_intra_tools_off != false)) {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [cpi->weber_bsize];
    for (; iVar12 < (cpi->frame_info).mi_rows; iVar12 = iVar12 + (uint)bVar1) {
      av1_calc_mb_wiener_var_row
                (cpi,&local_3920->mb,&(cpi->td).mb.e_mbd,iVar12,local_2860,(tran_low_t *)local_3860,
                 local_1060,local_2060,&local_3928,&local_3930,(cpi->td).wiener_tmp_pred_buf);
    }
  }
  else {
    (cpi->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read;
    (cpi->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt(cpi,iVar3,&local_3928,&local_3930);
  }
  if (((((cpi->oxcf).intra_mode_cfg.auto_intra_tools_off == true) &&
       ((cpi->common).quant_params.base_qindex < 0x80)) &&
      (iVar3 = (cpi->common).height * (cpi->common).width, 2.0 < local_3930 / (double)(iVar3 * 100))
      ) && (local_3928 / (double)iVar3 < 4.0)) {
    (cpi->oxcf).intra_mode_cfg.enable_smooth_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_paeth_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_cfl_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_diagonal_intra = false;
  }
  if ((cpi->oxcf).enable_rate_guide_deltaq != 0) {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [cpi->weber_bsize];
    __stream = fopen64((cpi->oxcf).rate_distribution_info,"r");
    if (__stream != (FILE *)0x0) {
      dVar16 = 0.0;
      for (uVar11 = 0; (int)uVar11 < (cpi->frame_info).mi_rows; uVar11 = uVar11 + 4) {
        iVar3 = (cpi->frame_info).mi_cols;
        for (uVar9 = 0; (int)uVar9 < iVar3; uVar9 = (ulong)((int)uVar9 + 4)) {
          iVar3 = __isoc99_fscanf(__stream,"%f",local_3860);
          if (iVar3 != 1) {
            fclose(__stream);
            goto LAB_00184ea1;
          }
          dVar16 = dVar16 + (double)local_3860[0];
          iVar3 = (cpi->frame_info).mi_cols;
          cpi->ext_rate_distribution[(int)((int)(uVar9 / bVar1) + (uVar11 / bVar1) * iVar3)] =
               (double)local_3860[0];
        }
      }
      fclose(__stream);
      iVar3 = 0;
      for (uVar11 = 0; (int)uVar11 < (cpi->frame_info).mi_rows; uVar11 = uVar11 + 4) {
        iVar10 = (cpi->frame_info).mi_cols;
        for (iVar12 = 0; iVar12 < iVar10; iVar12 = iVar12 + 4) {
          iVar4 = 0;
          for (uVar13 = 0; uVar13 < 4; uVar13 = uVar13 + bVar1) {
            for (uVar8 = 0; uVar8 < 4; uVar8 = uVar8 + bVar1) {
              iVar4 = iVar4 + cpi->prep_rate_estimates
                              [(int)((iVar12 + uVar8) / (uint)bVar1 +
                                    ((uVar13 | uVar11) / (uint)bVar1) * iVar10)];
            }
          }
          iVar3 = iVar3 + iVar4;
        }
      }
      cpi->ext_rate_scale = (double)iVar3 / dVar16;
    }
  }
LAB_00184ea1:
  bsize = ((cpi->common).seq_params)->sb_size;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  dVar17 = 0.0;
  dVar16 = 0.0;
  for (iVar3 = 0; iVar3 < (cpi->common).mi_params.mi_rows; iVar3 = iVar3 + (uint)bVar1) {
    iVar10 = 0;
    while( true ) {
      local_3944 = (uint)bVar1;
      if ((cpi->common).mi_params.mi_cols <= iVar10) break;
      iVar12 = get_var_perceptual_ai(cpi,bsize,iVar3,iVar10);
      iVar5 = get_satd(cpi,bsize,iVar3,iVar10);
      iVar6 = get_sse(cpi,bsize,iVar3,iVar10);
      dVar14 = (double)iVar6;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      dVar15 = log((double)iVar12);
      dVar16 = dVar16 + dVar15 * ((double)iVar5 / dVar14);
      dVar17 = dVar17 + (double)iVar5 / dVar14;
      iVar10 = iVar10 + local_3944;
    }
  }
  lVar7 = 1;
  if (0.0 < dVar17) {
    dVar16 = exp(dVar16 / dVar17);
    lVar7 = (long)dVar16;
  }
  if (lVar7 < 2) {
    lVar7 = 1;
  }
  cpi->norm_wiener_variance = lVar7;
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    dVar16 = 0.0;
    local_3950 = 0.0;
    for (iVar10 = 0; iVar10 < (cpi->common).mi_params.mi_rows; iVar10 = iVar10 + (uint)bVar1) {
      for (iVar12 = 0; iVar12 < (cpi->common).mi_params.mi_cols; iVar12 = iVar12 + (uint)bVar1) {
        iVar4 = get_var_perceptual_ai(cpi,bsize,iVar10,iVar12);
        lVar7 = cpi->norm_wiener_variance;
        dVar15 = (double)lVar7 / (double)iVar4;
        dVar14 = get_max_scale(cpi,((cpi->common).seq_params)->sb_size,iVar10,iVar12);
        dVar17 = 1.0;
        if (1.0 <= dVar14) {
          dVar17 = dVar14;
        }
        if (4.0 <= dVar15) {
          dVar15 = 4.0;
        }
        if (dVar15 <= 0.25) {
          dVar15 = 0.25;
        }
        if (1.0 / dVar17 <= dVar15) {
          iVar5 = get_satd(cpi,bsize,iVar10,iVar12);
          iVar6 = get_sse(cpi,bsize,iVar10,iVar12);
          dVar17 = (double)iVar6;
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          dVar14 = log((double)(int)((double)lVar7 / dVar15));
          local_3950 = local_3950 + dVar14 * ((double)iVar5 / dVar17);
          dVar16 = dVar16 + (double)iVar5 / dVar17;
        }
      }
    }
    if (dVar16 <= 0.0) {
      lVar7 = cpi->norm_wiener_variance;
    }
    else {
      dVar16 = exp(local_3950 / dVar16);
      lVar7 = (long)dVar16;
    }
    if (lVar7 < 2) {
      lVar7 = 1;
    }
    cpi->norm_wiener_variance = lVar7;
  }
  (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
  aom_free_frame_buffer(&((cpi->common).cur_frame)->buf);
  av1_dealloc_mb_wiener_var_pred_buf(local_3920);
  return;
}

Assistant:

void av1_set_mb_wiener_variance(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  av1_alloc_mb_wiener_var_pred_buf(&cpi->common, &cpi->td);
  cpi->norm_wiener_variance = 0;

  MACROBLOCK *x = &cpi->td.mb;
  MACROBLOCKD *xd = &x->e_mbd;
  // xd->mi needs to be setup since it is used in av1_frame_init_quantizer.
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  cm->quant_params.base_qindex = cpi->oxcf.rc_cfg.cq_level;
  av1_frame_init_quantizer(cpi);

  double sum_rec_distortion = 0.0;
  double sum_est_rate = 0.0;

  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
  AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  // Calculate differential contrast for each block for the entire image.
  // TODO(chengchen): properly accumulate the distortion and rate in
  // av1_calc_mb_wiener_var_mt(). Until then, call calc_mb_wiener_var() if
  // auto_intra_tools_off is true.
  if (num_workers > 1 && !cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
    intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read;
    intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt(cpi, num_workers, &sum_rec_distortion,
                              &sum_est_rate);
  } else {
    calc_mb_wiener_var(cpi, &sum_rec_distortion, &sum_est_rate);
  }

  // Determine whether to turn off several intra coding tools.
  automatic_intra_tools_off(cpi, sum_rec_distortion, sum_est_rate);

  // Read external rate distribution and use it to guide delta quantization
  if (cpi->oxcf.enable_rate_guide_deltaq) ext_rate_guided_quantization(cpi);

  const BLOCK_SIZE norm_block_size = cm->seq_params->sb_size;
  cpi->norm_wiener_variance = estimate_wiener_var_norm(cpi, norm_block_size);
  const int norm_step = mi_size_wide[norm_block_size];

  double sb_wiener_log = 0;
  double sb_count = 0;
  for (int its_cnt = 0; its_cnt < 2; ++its_cnt) {
    sb_wiener_log = 0;
    sb_count = 0;
    for (int mi_row = 0; mi_row < cm->mi_params.mi_rows; mi_row += norm_step) {
      for (int mi_col = 0; mi_col < cm->mi_params.mi_cols;
           mi_col += norm_step) {
        int sb_wiener_var =
            get_var_perceptual_ai(cpi, norm_block_size, mi_row, mi_col);

        double beta = (double)cpi->norm_wiener_variance / sb_wiener_var;
        double min_max_scale = AOMMAX(
            1.0, get_max_scale(cpi, cm->seq_params->sb_size, mi_row, mi_col));

        beta = AOMMIN(beta, 4);
        beta = AOMMAX(beta, 0.25);

        if (beta < 1 / min_max_scale) continue;

        sb_wiener_var = (int)(cpi->norm_wiener_variance / beta);

        int64_t satd = get_satd(cpi, norm_block_size, mi_row, mi_col);
        int64_t sse = get_sse(cpi, norm_block_size, mi_row, mi_col);
        double scaled_satd = (double)satd / sqrt((double)sse);
        sb_wiener_log += scaled_satd * log(sb_wiener_var);
        sb_count += scaled_satd;
      }
    }

    if (sb_count > 0)
      cpi->norm_wiener_variance = (int64_t)(exp(sb_wiener_log / sb_count));
    cpi->norm_wiener_variance = AOMMAX(1, cpi->norm_wiener_variance);
  }

  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
  aom_free_frame_buffer(&cm->cur_frame->buf);
  av1_dealloc_mb_wiener_var_pred_buf(&cpi->td);
}